

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.h
# Opt level: O0

void __thiscall midi_container::limit_port_number<unsigned_char>(midi_container *this,uchar *number)

{
  size_type sVar1;
  const_reference pvVar2;
  uint local_1c;
  uint i;
  uchar *number_local;
  midi_container *this_local;
  
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_port_numbers);
    if (sVar1 <= local_1c) {
      return;
    }
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_port_numbers,(ulong)local_1c);
    if (*pvVar2 == *number) break;
    local_1c = local_1c + 1;
  }
  *number = (uchar)local_1c;
  return;
}

Assistant:

void limit_port_number(T & number) const
    {
        for ( unsigned i = 0; i < m_port_numbers.size(); i++ )
        {
            if ( m_port_numbers[ i ] == number )
            {
                number = i;
                return;
            }
        }
    }